

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* boost::xpressive::detail::
  make_char_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
            (char ch,syntax_option_type flags,
            regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr)

{
  syntax_option_type sVar1;
  syntax_option_type in_EDX;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_mpl_::bool_<false>_>
  matcher_1;
  literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_mpl_::bool_<false>_>
  matcher;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  char_type ch_00;
  literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_mpl_::bool_<false>_>
  *in_stack_ffffffffffffffe0;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matcher_00;
  
  psVar2 = in_RDI;
  matcher_00 = in_RDI;
  sVar1 = regex_constants::operator&(icase_,in_EDX);
  ch_00 = (char_type)((ulong)psVar2 >> 0x38);
  if (sVar1 == ECMAScript) {
    literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_mpl_::bool_<false>_>
    ::literal_matcher((literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_mpl_::bool_<false>_>
                       *)in_stack_ffffffffffffffe0,ch_00,
                      (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)in_RDI);
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>,mpl_::bool_<false>>>
              ((literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>,_mpl_::bool_<false>_>
                *)matcher_00);
  }
  else {
    literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_mpl_::bool_<false>_>
    ::literal_matcher(in_stack_ffffffffffffffe0,ch_00,
                      (regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *)in_RDI);
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::literal_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<true>,mpl_::bool_<false>>>
              ((literal_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<true>,_mpl_::bool_<false>_>
                *)matcher_00);
  }
  return psVar2;
}

Assistant:

inline sequence<BidiIter> make_char_xpression
(
    Char ch
  , regex_constants::syntax_option_type flags
  , Traits const &tr
)
{
    if(0 != (regex_constants::icase_ & flags))
    {
        literal_matcher<Traits, mpl::true_, mpl::false_> matcher(ch, tr);
        return make_dynamic<BidiIter>(matcher);
    }
    else
    {
        literal_matcher<Traits, mpl::false_, mpl::false_> matcher(ch, tr);
        return make_dynamic<BidiIter>(matcher);
    }
}